

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

Offset<MyGame::Example::Monster>
MyGame::Example::CreateMonster
          (FlatBufferBuilder *_fbb,Vec3 *pos,int16_t mana,int16_t hp,
          Offset<flatbuffers::String> name,Offset<flatbuffers::Vector<unsigned_char>_> inventory,
          int8_t color,uint8_t test_type,Offset<void> test,
          Offset<flatbuffers::Vector<const_MyGame::Example::Test_*>_> test4)

{
  Offset<MyGame::Example::Monster> OVar1;
  undefined1 local_48 [8];
  MonsterBuilder builder_;
  int16_t hp_local;
  int16_t mana_local;
  Vec3 *pos_local;
  FlatBufferBuilder *_fbb_local;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*>_> test4_local;
  Offset<void> test_local;
  Offset<flatbuffers::Vector<unsigned_char>_> inventory_local;
  Offset<flatbuffers::String> name_local;
  
  builder_._12_2_ = hp;
  builder_._14_2_ = mana;
  MonsterBuilder::MonsterBuilder((MonsterBuilder *)local_48,_fbb);
  MonsterBuilder::add_test4((MonsterBuilder *)local_48,test4);
  MonsterBuilder::add_test((MonsterBuilder *)local_48,test);
  MonsterBuilder::add_inventory((MonsterBuilder *)local_48,inventory);
  MonsterBuilder::add_name((MonsterBuilder *)local_48,name);
  MonsterBuilder::add_pos((MonsterBuilder *)local_48,pos);
  MonsterBuilder::add_hp((MonsterBuilder *)local_48,builder_._12_2_);
  MonsterBuilder::add_mana((MonsterBuilder *)local_48,builder_._14_2_);
  MonsterBuilder::add_test_type((MonsterBuilder *)local_48,test_type);
  MonsterBuilder::add_color((MonsterBuilder *)local_48,color);
  OVar1 = MonsterBuilder::Finish((MonsterBuilder *)local_48);
  return (Offset<MyGame::Example::Monster>)OVar1.o;
}

Assistant:

inline flatbuffers::Offset<Monster> CreateMonster(flatbuffers::FlatBufferBuilder &_fbb, const Vec3 *pos, int16_t mana, int16_t hp, flatbuffers::Offset<flatbuffers::String> name, flatbuffers::Offset<flatbuffers::Vector<uint8_t>> inventory, int8_t color, uint8_t test_type, flatbuffers::Offset<void> test, flatbuffers::Offset<flatbuffers::Vector<const Test *>> test4) {
  MonsterBuilder builder_(_fbb);
  builder_.add_test4(test4);
  builder_.add_test(test);
  builder_.add_inventory(inventory);
  builder_.add_name(name);
  builder_.add_pos(pos);
  builder_.add_hp(hp);
  builder_.add_mana(mana);
  builder_.add_test_type(test_type);
  builder_.add_color(color);
  return builder_.Finish();
}